

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Method.cpp
# Opt level: O1

CompiledMethod *
Lodtalk::CompiledMethod::newMethodWithHeader
          (VMContext *context,size_t numberOfBytes,CompiledMethodHeader header)

{
  ulong uVar1;
  CompiledMethod *pCVar2;
  ProtoObject PVar3;
  long lVar4;
  ProtoObject PVar5;
  
  uVar1 = numberOfBytes + 0xf;
  if (numberOfBytes + 8 <= (uVar1 & 0xfffffffffffffff8)) {
    PVar5.object_header_ = (ObjectHeader)(uVar1 >> 3);
    pCVar2 = (CompiledMethod *)
             VMContext::allocateObjectMemory(context,(uVar1 & 0xfffffffffffffff8) + 8,0x7f7 < uVar1)
    ;
    PVar3.object_header_ = (ObjectHeader)0xff;
    if ((ulong)PVar5.object_header_ < 0xff) {
      PVar3.object_header_ = PVar5.object_header_;
    }
    (pCVar2->super_ByteArray).super_ArrayedCollection.super_SequenceableCollection.super_Collection.
    super_Object.super_ProtoObject.object_header_ =
         (ObjectHeader)
         ((ulong)((uint)numberOfBytes & 7) << 0x23 | (ulong)PVar3.object_header_ |
          (ulong)(((uint)pCVar2 & 0xfffffff8) << 7) | 0x158c000000000 |
         (ulong)(pCVar2->super_ByteArray).super_ArrayedCollection.super_SequenceableCollection.
                super_Collection.super_Object.super_ProtoObject.object_header_ & 0x30700000300);
    if (0x7f7 < uVar1) {
      pCVar2[-1].super_ByteArray.super_ArrayedCollection.super_SequenceableCollection.
      super_Collection.super_Object.super_ProtoObject.object_header_ = PVar5.object_header_;
    }
    lVar4 = 0;
    do {
      pCVar2[lVar4 + 1].super_ByteArray.super_ArrayedCollection.super_SequenceableCollection.
      super_Collection.super_Object.super_ProtoObject.object_header_ = (ObjectHeader)&NilObject;
      lVar4 = lVar4 + 1;
    } while (((ulong)header.oop.field_0 >> 1 & 0xffff) + 1 != lVar4);
    pCVar2[1].super_ByteArray.super_ArrayedCollection.super_SequenceableCollection.super_Collection.
    super_Object.super_ProtoObject.object_header_ = (ObjectHeader)header.oop.field_0;
    return pCVar2;
  }
  __assert_fail("slotCount*wordSize >= numberOfBytes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/Method.cpp"
                ,0x24,
                "static CompiledMethod *Lodtalk::CompiledMethod::newMethodWithHeader(VMContext *, size_t, CompiledMethodHeader)"
               );
}

Assistant:

CompiledMethod *CompiledMethod::newMethodWithHeader(VMContext *context, size_t numberOfBytes, CompiledMethodHeader header)
{
	// Add the method header size
	numberOfBytes += sizeof(void*);

	// Compute the some masks
	const size_t wordSize = sizeof(void*);
	const size_t wordMask = wordSize -1;

	// Compute the number of slots
	size_t slotCount = ((numberOfBytes + wordSize - 1) & (~wordMask)) / wordSize;
	size_t extraFormatBits = numberOfBytes & wordMask;
	assert(slotCount*wordSize >= numberOfBytes);

	// Compute the header size.
	auto headerSize = sizeof(ObjectHeader);
	auto bodySize = slotCount*sizeof(void*);
	auto objectSize = headerSize + bodySize;

	// Allocate the compiled method
    auto bigObject = slotCount >= 255;
	auto methodData = context->allocateObjectMemory(objectSize, bigObject);
	auto objectHeader = reinterpret_cast<ObjectHeader*> (methodData);

	// Set the method header
	objectHeader->slotCount = slotCount < 255 ? slotCount : 255;
	objectHeader->identityHash = generateIdentityHash(methodData);
	objectHeader->objectFormat = (unsigned int)(OF_COMPILED_METHOD + extraFormatBits);
	objectHeader->classIndex = SCI_CompiledMethod;
	if(bigObject)
        reinterpret_cast<uint64_t*> (objectHeader)[-1] = slotCount;

	// Initialize the literals to nil
	auto methodBody = reinterpret_cast<Oop*> (methodData + headerSize);
	auto literalCount = header.getLiteralCount();
	for(size_t i = 0; i < literalCount + 1; ++i )
		methodBody[i] = nilOop();

	// Set the method header
	auto methodHeader = reinterpret_cast<CompiledMethodHeader*> (methodBody);
	*methodHeader = header;

	// Return the compiled method.
	return reinterpret_cast<CompiledMethod*> (methodData);
}